

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApprovalTestNamer.cpp
# Opt level: O2

void __thiscall ApprovalTests::TestName::setFileName(TestName *this,string *file)

{
  TestName *this_00;
  string local_30;
  
  this_00 = (TestName *)file;
  ::std::__cxx11::string::_M_assign((string *)&this->originalFileName);
  if (file->_M_string_length == 0) {
    handleBoostQuirks_abi_cxx11_(&local_30,this_00);
  }
  else {
    findFileName(&local_30,this_00,file);
  }
  ::std::__cxx11::string::operator=((string *)&this->fileName,(string *)&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void TestName::setFileName(const std::string& file)
    {
        originalFileName = file;
        fileName = file.empty() ? handleBoostQuirks() : findFileName(file);
    }